

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O1

void __thiscall
pbrt::MLTSampler::StartPixelSample(MLTSampler *this,Point2i *p,int sampleIndex,int dim)

{
  uint64_t uVar1;
  bool bVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  uint64_t uVar8;
  ulong uVar9;
  
  lVar3 = 0x5851f42d4c957f2d;
  uVar7 = (long)(p->super_Tuple2<pbrt::Point2,_int>).y * 0x10000 +
          (long)(p->super_Tuple2<pbrt::Point2,_int>).x;
  uVar9 = (uVar7 >> 0x1f ^ uVar7) * 0x7fb5d329728ea185;
  uVar9 = (uVar9 >> 0x1b ^ uVar9) * -0x7e25210b43d22bb3;
  uVar8 = uVar7 * 2 + 1;
  (this->rng).inc = uVar8;
  uVar1 = ((uVar9 >> 0x21 ^ uVar9) + 1) * 0x5851f42d4c957f2d + uVar7 * -0x4f5c17a566d501a4 + 1;
  (this->rng).state = uVar1;
  iVar4 = dim * 0x2000 + sampleIndex * 0x10000;
  if (iVar4 == 0) {
    lVar6 = 0;
    lVar5 = 1;
  }
  else {
    lVar5 = 1;
    lVar6 = 0;
    uVar7 = (long)iVar4;
    do {
      if ((uVar7 & 1) != 0) {
        lVar5 = lVar5 * lVar3;
        lVar6 = lVar6 * lVar3 + uVar8;
      }
      uVar8 = uVar8 * (lVar3 + 1);
      lVar3 = lVar3 * lVar3;
      bVar2 = 1 < uVar7;
      uVar7 = uVar7 >> 1;
    } while (bVar2);
  }
  (this->rng).state = lVar5 * uVar1 + lVar6;
  return;
}

Assistant:

PBRT_CPU_GPU
    void StartPixelSample(const Point2i &p, int sampleIndex, int dim) {
        rng.SetSequence(p.x + p.y * 65536);
        rng.Advance(sampleIndex * 65536 + dim * 8192);
    }